

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_expand.cxx
# Opt level: O0

int fl_filename_expand(char *to,int tolen,char *from)

{
  char cVar1;
  char *dst;
  size_t sVar2;
  passwd *ppVar3;
  bool bVar4;
  int local_68;
  int t_2;
  char t_1;
  char t;
  passwd *pwd;
  char *value;
  char *e;
  char *a;
  char *pcStack_38;
  int ret;
  char *end;
  char *start;
  char *temp;
  char *from_local;
  int tolen_local;
  char *to_local;
  
  dst = (char *)operator_new__((long)tolen);
  fl_strlcpy(dst,from,(long)tolen);
  sVar2 = strlen(dst);
  pcStack_38 = dst + sVar2;
  a._4_4_ = 0;
  e = dst;
  end = dst;
  while (e < pcStack_38) {
    value = e;
    while( true ) {
      bVar4 = false;
      if (value < pcStack_38) {
        bVar4 = *value != '/';
      }
      if (!bVar4) break;
      value = value + 1;
    }
    pwd = (passwd *)0x0;
    if (*e == '$') {
      cVar1 = *value;
      *value = '\0';
      pwd = (passwd *)fl_getenv(e + 1);
      *value = cVar1;
    }
    else if (*e == '~') {
      if (e + 1 < value) {
        cVar1 = *value;
        *value = '\0';
        ppVar3 = getpwnam(e + 1);
        *value = cVar1;
        if (ppVar3 != (passwd *)0x0) {
          pwd = (passwd *)ppVar3->pw_dir;
        }
      }
      else {
        pwd = (passwd *)fl_getenv("HOME");
      }
    }
    if (pwd == (passwd *)0x0) {
      e = value + 1;
    }
    else {
      if (*(char *)&pwd->pw_name == '/') {
        end = e;
      }
      sVar2 = strlen((char *)pwd);
      local_68 = (int)sVar2;
      if (*(char *)((long)&pwd->pw_name + (long)(local_68 + -1)) == '/') {
        local_68 = local_68 + -1;
      }
      if ((long)tolen <= (long)(pcStack_38 + (long)local_68 + (1 - (long)value))) {
        pcStack_38 = value + ((long)tolen - (long)local_68) + -1;
      }
      memmove(e + local_68,value,(size_t)(pcStack_38 + (1 - (long)value)));
      pcStack_38 = e + (long)(pcStack_38 + ((long)local_68 - (long)value));
      *pcStack_38 = '\0';
      memcpy(e,pwd,(long)local_68);
      a._4_4_ = a._4_4_ + 1;
    }
  }
  fl_strlcpy(to,end,(long)tolen);
  if (dst != (char *)0x0) {
    operator_delete__(dst);
  }
  return a._4_4_;
}

Assistant:

int fl_filename_expand(char *to,int tolen, const char *from) {

  char *temp = new char[tolen];
  strlcpy(temp,from, tolen);
  char *start = temp;
  char *end = temp+strlen(temp);

  int ret = 0;

  for (char *a=temp; a<end; ) {	// for each slash component
    char *e; for (e=a; e<end && !isdirsep(*e); e++) {/*empty*/} // find next slash
    const char *value = 0; // this will point at substitute value
    switch (*a) {
    case '~':	// a home directory name
      if (e <= a+1) {	// current user's directory
        value = fl_getenv("HOME");
#ifndef WIN32
      } else {	// another user's directory
	struct passwd *pwd;
	char t = *e; *(char *)e = 0; 
        pwd = getpwnam(a+1); 
        *(char *)e = t;
	    if (pwd) value = pwd->pw_dir;
#endif
      }
      break;
    case '$':		/* an environment variable */
      {char t = *e; *(char *)e = 0; value = fl_getenv(a+1); *(char *)e = t;}
      break;
    }
    if (value) {
      // substitutions that start with slash delete everything before them:
      if (isdirsep(value[0])) start = a;
#if defined(WIN32) || defined(__EMX__) && !defined(__CYGWIN__)
      // also if it starts with "A:"
      if (value[0] && value[1]==':') start = a;
#endif
      int t = (int) strlen(value); if (isdirsep(value[t-1])) t--;
      if ((end+1-e+t) >= tolen) end += tolen - (end+1-e+t);
      memmove(a+t, e, end+1-e);
      end = a+t+(end-e);
      *end = '\0';
      memcpy(a, value, t);
      ret++;
    } else {
      a = e+1;
#if defined(WIN32) || defined(__EMX__) && !defined(__CYGWIN__)
      if (*e == '\\') {*e = '/'; ret++;} // ha ha!
#endif
    }
  }

  strlcpy(to, start, tolen);

  delete[] temp;

  return ret;
}